

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int __thiscall re2::RE2::Options::ParseFlags(Options *this)

{
  bool bVar1;
  Encoding EVar2;
  ostream *poVar3;
  LogMessage local_198;
  uint local_14;
  Options *pOStack_10;
  int flags;
  Options *this_local;
  
  local_14 = 4;
  pOStack_10 = this;
  EVar2 = encoding(this);
  if (EVar2 != EncodingUTF8) {
    if (EVar2 == EncodingLatin1) {
      local_14 = local_14 | 0x20;
    }
    else {
      bVar1 = log_errors(this);
      if (bVar1) {
        LogMessage::LogMessage
                  (&local_198,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x79,2);
        poVar3 = LogMessage::stream(&local_198);
        poVar3 = std::operator<<(poVar3,"Unknown encoding ");
        EVar2 = encoding(this);
        std::ostream::operator<<(poVar3,EVar2);
        LogMessage::~LogMessage(&local_198);
      }
    }
  }
  bVar1 = posix_syntax(this);
  if (!bVar1) {
    local_14 = local_14 | 0x794;
  }
  bVar1 = literal(this);
  if (bVar1) {
    local_14 = local_14 | 2;
  }
  bVar1 = never_nl(this);
  if (bVar1) {
    local_14 = local_14 | 0x800;
  }
  bVar1 = dot_nl(this);
  if (bVar1) {
    local_14 = local_14 | 8;
  }
  bVar1 = never_capture(this);
  if (bVar1) {
    local_14 = local_14 | 0x1000;
  }
  bVar1 = case_sensitive(this);
  if (!bVar1) {
    local_14 = local_14 | 1;
  }
  bVar1 = perl_classes(this);
  if (bVar1) {
    local_14 = local_14 | 0x80;
  }
  bVar1 = word_boundary(this);
  if (bVar1) {
    local_14 = local_14 | 0x100;
  }
  bVar1 = one_line(this);
  if (bVar1) {
    local_14 = local_14 | 0x10;
  }
  return local_14;
}

Assistant:

int RE2::Options::ParseFlags() const {
  int flags = Regexp::ClassNL;
  switch (encoding()) {
    default:
      if (log_errors())
        LOG(ERROR) << "Unknown encoding " << encoding();
      break;
    case RE2::Options::EncodingUTF8:
      break;
    case RE2::Options::EncodingLatin1:
      flags |= Regexp::Latin1;
      break;
  }

  if (!posix_syntax())
    flags |= Regexp::LikePerl;

  if (literal())
    flags |= Regexp::Literal;

  if (never_nl())
    flags |= Regexp::NeverNL;

  if (dot_nl())
    flags |= Regexp::DotNL;

  if (never_capture())
    flags |= Regexp::NeverCapture;

  if (!case_sensitive())
    flags |= Regexp::FoldCase;

  if (perl_classes())
    flags |= Regexp::PerlClasses;

  if (word_boundary())
    flags |= Regexp::PerlB;

  if (one_line())
    flags |= Regexp::OneLine;

  return flags;
}